

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void render_pixel(BG_shift_registers *BG_regs,uint16_t scanline,uint16_t dot)

{
  byte bVar1;
  uint16_t local_1c;
  _Bool local_19;
  _Bool local_18;
  byte local_17;
  uint16_t pallete_data;
  uint16_t pallete_address;
  uint8_t sprite_pattern;
  _Bool sprite_is_sprite0;
  _Bool sprite_behind_bg;
  uint8_t sprite_pallete;
  uint16_t pixel;
  uint16_t dot_local;
  uint16_t scanline_local;
  BG_shift_registers *BG_regs_local;
  
  pallete_data = dot - 1;
  pallete_address = dot;
  _sprite_pattern = scanline;
  _sprite_behind_bg = BG_regs;
  bVar1 = get_sprite_pixel(&local_17,&local_18,&local_19,dot);
  if ((bVar1 == 0) || ((local_18 & 1U) != 0)) {
    local_1c = get_pallete_address(_sprite_behind_bg);
  }
  else {
    local_1c = (ushort)local_17 << 2 | 0x3f10 | (ushort)bVar1;
  }
  bVar1 = read_VRAM(local_1c);
  pixel_data[_sprite_pattern][pallete_data] = RGB_colors[bVar1];
  return;
}

Assistant:

void render_pixel(BG_shift_registers* BG_regs, uint16_t scanline, uint16_t dot) {
    // PPU is behind 2 pixels
    uint16_t pixel = dot - 1;
    uint8_t sprite_pallete;
    bool sprite_behind_bg;
    bool sprite_is_sprite0;
    uint8_t sprite_pattern = get_sprite_pixel(
        &sprite_pallete,
        &sprite_behind_bg,
        &sprite_is_sprite0,
        dot
    );

    uint16_t pallete_address;
    if(sprite_pattern && !sprite_behind_bg)
        pallete_address = 0x3F10 | (sprite_pallete << 2) | sprite_pattern;
    else
        pallete_address = get_pallete_address(BG_regs);

    uint16_t pallete_data = read_VRAM(pallete_address);
    // Cycle 0 is idle so we have to subtract 1 to get right dot
    pixel_data[scanline][pixel] = RGB_colors[pallete_data];
}